

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_generator.hpp
# Opt level: O2

node_pointer __thiscall
ranger::bhvr_tree::abstract_generator<$86869e04$>::generate_node_by_name
          (abstract_generator<_86869e04_> *this,char *name,xml_node<char> *data)

{
  const_iterator cVar1;
  code *pcVar2;
  ostream *poVar3;
  allocator local_51;
  key_type local_50;
  
  std::__cxx11::string::string((string *)&local_50,(char *)data,&local_51);
  cVar1 = std::_Rb_tree<$6d46f28e$>::find((_Rb_tree<_6d46f28e_> *)(name + 0x60),&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (cVar1._M_node == (_Base_ptr)(name + 0x68)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"bhvr_tree_error: cannot find node[");
    poVar3 = std::operator<<(poVar3,(char *)data);
    poVar3 = std::operator<<(poVar3,"]\'s generate handler");
    std::endl<char,std::char_traits<char>>(poVar3);
    (this->super_generator_interface<_86869e04_>).
    super_generator_unit<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_rapidxml::xml_node<char>_*,_ranger::bhvr_tree::selector_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>
    ._vptr_generator_unit = (_func_int **)0x0;
  }
  else {
    pcVar2 = *(code **)(cVar1._M_node + 2);
    if (((ulong)pcVar2 & 1) != 0) {
      pcVar2 = *(code **)(pcVar2 + *(long *)(name + (long)cVar1._M_node[2]._M_parent) + -1);
    }
    (*pcVar2)(this,name + (long)cVar1._M_node[2]._M_parent);
  }
  return (__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
          )(__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
            )this;
}

Assistant:

node_pointer generate_node_by_name(const char* name, Data data) const {
    auto it = m_generate_handlers.find(name);
    if (it == m_generate_handlers.end()) {
      std::cerr << "bhvr_tree_error: cannot find node[" << name << "]'s generate handler" << std::endl;
      return node_pointer();
    }

    return (this->*it->second)(data);
  }